

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

int __thiscall
CVmConsole::open_script_file
          (CVmConsole *this,vm_val_t *filespec,vm_rcdesc *rc,int quiet,int script_more_mode)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  CVmNetFile *nf;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  uint local_110 [2];
  long local_108;
  void *local_100;
  __jmp_buf_tag local_f8;
  undefined4 extraout_var;
  
  G_err_frame::__tls_init();
  local_108 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_110;
  local_110[0] = _setjmp(&local_f8);
  if (local_110[0] == 0) {
    iVar3 = CVmNetFile::open((char *)filespec,(int)rc,1,5,"text/plain");
    nf = (CVmNetFile *)CONCAT44(extraout_var,iVar3);
    CVmObjFile::check_safety_for_open(nf,1);
  }
  else {
    nf = (CVmNetFile *)0x0;
  }
  if ((local_110[0] == 1) && (local_110[0] = 2, nf != (CVmNetFile *)0x0)) {
    CVmNetFile::abandon(nf);
    err_rethrow();
  }
  lVar1 = local_108;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar1;
  if ((local_110[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar2 = local_100;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_110[0] & 2) != 0) {
    free(local_100);
  }
  iVar3 = open_script_file(this,nf,filespec,quiet,script_more_mode);
  return iVar3;
}

Assistant:

int CVmConsole::open_script_file(VMG_ const vm_val_t *filespec,
                                 const struct vm_rcdesc *rc,
                                 int quiet, int script_more_mode)
{
    CVmNetFile *nf = 0;
    err_try
    {
        /* create the network file descriptor */
        nf = CVmNetFile::open(
            vmg_ filespec, rc, NETF_READ, OSFTCMD, "text/plain");

        /* validate file safety */
        CVmObjFile::check_safety_for_open(vmg_ nf, VMOBJFILE_ACCESS_READ);
    }